

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_observer.hpp
# Opt level: O3

void __thiscall
afsm::test::test_fsm_observer::
state_changed<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::transaction::idle,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::exiting,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::events::commit>
          (test_fsm_observer *this,
          inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *param_1,state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                   *param_2,
          state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
          *param_3,commit *param_4)

{
  long lVar1;
  ostream *poVar2;
  ostream *poVar3;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  poVar2 = psst::operator<<((ostream *)&std::cerr,blue|bright);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x11;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar3 = poVar2 + lVar1;
  if (poVar2[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x2a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"*",1);
  poVar2 = psst::operator<<(poVar2,clear);
  poVar3 = poVar2 + *(long *)(*(long *)poVar2 + -0x18);
  if (poVar2[*(long *)(*(long *)poVar2 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar3);
    poVar3[0xe1] = (ostream)0x1;
  }
  poVar3[0xe0] = (ostream)0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": State changed ",0x10);
  psst::util::demangle<afsm::test::connection_fsm_def::transaction::idle>();
  get_name_components_after(&local_98,&local_38,&this->def_name);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
  psst::util::demangle<afsm::test::connection_fsm_def::transaction::exiting>();
  get_name_components_after(&local_b8,&local_58,&this->def_name);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  psst::util::demangle<afsm::test::events::commit>();
  get_name_components(&local_d8,&local_78,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
    state_changed(FSM const&, SourceState const&, TargetState const&, Event const&) const noexcept
    {
        using ::psst::ansi_color;
        using ::psst::util::demangle;
        ::std::cerr
             << (ansi_color::blue | ansi_color::bright)
             << ::std::setw(event_name_width) << ::std::setfill('*')
             << "*" << ansi_color::clear  << ::std::setfill(' ')
             << ": State changed "
             << get_name_components_after(
                     demangle< typename SourceState::state_definition_type >(),
                     def_name)
             << " -> "
             << get_name_components_after(
                     demangle< typename TargetState::state_definition_type >(),
                     def_name)
             << " (" << get_name_components(demangle<Event>(), 1) << ")\n";
    }